

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miam-core.c
# Opt level: O0

void la_miam_core_format_json(la_vstring *vstr,void *data)

{
  la_vstring *in_RSI;
  la_miam_core_pdu *pdu;
  la_vstring *vstr_00;
  
  if (((ulong)in_RSI->str & 0xffff) == 0) {
    vstr_00 = in_RSI;
    la_json_append_int64(in_RSI,(char *)in_RSI,0x17e020);
    la_json_append_int64(vstr_00,(char *)in_RSI,0x17e03a);
  }
  else {
    la_miam_errors_format_json(in_RSI,(uint32_t)((ulong)in_RSI >> 0x20));
  }
  return;
}

Assistant:

void la_miam_core_format_json(la_vstring *vstr, void const *data) {
	la_assert(vstr);
	la_assert(data);

	la_miam_core_pdu const *pdu = data;
	if(pdu->err & LA_MIAM_ERR_HDR) {
		la_miam_errors_format_json(vstr, pdu->err & LA_MIAM_ERR_HDR);
		return;
	}
	la_json_append_int64(vstr, "version", pdu->version);
	la_json_append_int64(vstr, "pdu_type", pdu->pdu_type);
}